

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

CSVOption<char> duckdb::CSVOption<char>::Deserialize(Deserializer *deserializer)

{
  undefined8 in_RAX;
  CSVOption<char> result;
  
  result = (CSVOption<char>)((ushort)((ulong)in_RAX >> 0x30) & 0xff00);
  Deserializer::ReadPropertyWithDefault<bool>(deserializer,100,"set_by_user",&result.set_by_user);
  Deserializer::ReadProperty<char>(deserializer,0x65,"value",&result.value);
  return result;
}

Assistant:

CSVOption<T> CSVOption<T>::Deserialize(Deserializer &deserializer) {
	CSVOption<T> result;
	deserializer.ReadPropertyWithDefault<bool>(100, "set_by_user", result.set_by_user);
	deserializer.ReadProperty<T>(101, "value", result.value);
	return result;
}